

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadStr(BinaryReader *this,string_view *out_str,char *desc)

{
  Offset *pOVar1;
  Offset OVar2;
  ulong s_length;
  bool bVar3;
  uint in_EAX;
  Result RVar4;
  char *format;
  uint8_t *s;
  ulong uStack_28;
  uint32_t str_len;
  
  uStack_28 = (ulong)in_EAX;
  RVar4 = ReadU32Leb128(this,&str_len,"string length");
  if (RVar4.enum_ != Error) {
    OVar2 = (this->state_).offset;
    s_length = uStack_28 >> 0x20;
    if (this->read_end_ < OVar2 + s_length) {
      format = "unable to read string: %s";
    }
    else {
      s = (this->state_).data + OVar2;
      out_str->_M_len = s_length;
      out_str->_M_str = (char *)s;
      pOVar1 = &(this->state_).offset;
      *pOVar1 = *pOVar1 + s_length;
      bVar3 = IsValidUtf8((char *)s,s_length);
      if (bVar3) {
        return (Result)Ok;
      }
      format = "invalid utf-8 encoding: %s";
    }
    PrintError(this,format,desc);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadStr(std::string_view* out_str, const char* desc) {
  uint32_t str_len = 0;
  CHECK_RESULT(ReadU32Leb128(&str_len, "string length"));

  ERROR_UNLESS(state_.offset + str_len <= read_end_,
               "unable to read string: %s", desc);

  *out_str = std::string_view(
      reinterpret_cast<const char*>(state_.data) + state_.offset, str_len);
  state_.offset += str_len;

  ERROR_UNLESS(IsValidUtf8(out_str->data(), out_str->length()),
               "invalid utf-8 encoding: %s", desc);
  return Result::Ok;
}